

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

attribute_keys_map_t * tchecker::system::system_t::known_attributes_abi_cxx11_(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_5e;
  undefined1 local_5d;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  iterator local_20;
  size_type local_18;
  attribute_keys_map_t *local_10;
  
  if (known_attributes[abi:cxx11]()::known_attr_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_);
    if (iVar1 != 0) {
      local_10 = &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl._0_8_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems);
      local_10 = (attribute_keys_map_t *)0x34cfd8;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl._0_8_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 1);
      local_10 = (attribute_keys_map_t *)0x34d008;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl._0_8_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 2);
      local_10 = (attribute_keys_map_t *)0x34d038;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl._0_8_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 3);
      local_10 = (attribute_keys_map_t *)0x34d068;
      local_5d = 1;
      local_48 = &local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"initial",&local_49);
      local_5d = 0;
      local_20 = &local_40;
      local_18 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_5f);
      __l._M_len = local_18;
      __l._M_array = local_20;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 4,__l,&local_5e,
            &local_5f);
      local_10 = (attribute_keys_map_t *)0x34d098;
      memset(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 5,0,0x30);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 5);
      local_10 = (attribute_keys_map_t *)0x34d0c8;
      memset(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 6,0,0x30);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 6);
      local_10 = (attribute_keys_map_t *)0x34d0f8;
      memset(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 7,0,0x30);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 7);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_5f);
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
      do {
        local_98 = local_98 + -1;
        std::__cxx11::string::~string((string *)local_98);
      } while (local_98 != &local_40);
      std::allocator<char>::~allocator(&local_49);
      __cxa_atexit(std::
                   array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_8UL>
                   ::~array,&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_);
    }
  }
  return &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_;
}

Assistant:

tchecker::system::attribute_keys_map_t const & system_t::known_attributes()
{
  static tchecker::system::attribute_keys_map_t const known_attr = {{
      {},          // tchecker::system::ATTR_CLOCK
      {},          // tchecker::system::ATTR_EDGE
      {},          // tchecker::system::ATTR_EVENT
      {},          // tchecker::system::ATTR_INTVAR
      {"initial"}, // tchecker::system::ATTR_LOCATION
      {},          // tchecker::system::ATTR_PROCESS
      {},          // tchecker::system::ATTR_SYNC
      {}           // tchecker::system::ATTR_SYSTEM
  }};
  return known_attr;
}